

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentList::CreateFromComponentList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<ON_COMPONENT_INDEX> *component_list)

{
  bool bVar1;
  TYPE TVar2;
  uint uVar3;
  ON_COMPONENT_INDEX *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *v;
  uint vertex_id;
  ON_COMPONENT_INDEX ci;
  uint i;
  uint marked_count;
  undefined1 local_60 [4];
  uint count;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  ON_SimpleArray<ON_COMPONENT_INDEX> *component_list_local;
  ON_SubD *subd_local;
  ON_SubDComponentList *this_local;
  
  saved_marks._56_8_ = component_list;
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60,subd);
  TVar2 = ON_SimpleArray<ON_COMPONENT_INDEX>::UnsignedCount
                    ((ON_SimpleArray<ON_COMPONENT_INDEX> *)saved_marks._56_8_);
  ci.m_index = 0;
  for (ci.m_type = invalid_type; ci.m_type < TVar2; ci.m_type = ci.m_type + brep_vertex) {
    pOVar4 = ON_SimpleArray<ON_COMPONENT_INDEX>::operator[]
                       ((ON_SimpleArray<ON_COMPONENT_INDEX> *)saved_marks._56_8_,ci.m_type);
    v._4_4_ = (*pOVar4).m_type;
    if (v._4_4_ == subd_vertex) {
      vertex_id = (*pOVar4).m_index;
      pOVar5 = ON_SubD::VertexFromId(subd,vertex_id);
      if ((pOVar5 != (ON_SubDVertex *)0x0) &&
         (bVar1 = ON_ComponentStatus::RuntimeMark(&(pOVar5->super_ON_SubDComponentBase).m_status),
         !bVar1)) {
        ON_ComponentStatus::SetRuntimeMark(&(pOVar5->super_ON_SubDComponentBase).m_status);
        ci.m_index = ci.m_index + 1;
      }
    }
  }
  uVar3 = Internal_Create(this,subd,true,true,true,true,ci.m_index);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60);
  return uVar3;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromComponentList(const ON_SubD& subd, const ON_SimpleArray<ON_COMPONENT_INDEX>& component_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = component_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_COMPONENT_INDEX ci = component_list[i];
    if (ON_COMPONENT_INDEX::TYPE::subd_vertex != ci.m_type)
      continue;
    const unsigned vertex_id = (unsigned)ci.m_index;
    const ON_SubDVertex* v = subd.VertexFromId(vertex_id);
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, true, true, true, marked_count);
}